

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vhost.c
# Opt level: O0

int lws_role_call_adoption_bind(lws *wsi,int type,char *prot)

{
  char *pcVar1;
  int iVar2;
  lws_role_ops *plVar3;
  lws_log_cx *plVar4;
  char **ppcVar5;
  lws_role_ops *ar;
  lws_role_ops **ppxx;
  lws_role_ops *role;
  char *pcStack_28;
  int n;
  char *prot_local;
  int type_local;
  lws *wsi_local;
  
  pcStack_28 = prot;
  prot_local._4_4_ = type;
  if (((((wsi->a).vhost)->options & 0x400000) == 0x400000) &&
     (((wsi->a).vhost)->listen_accept_role != (char *)0x0)) {
    plVar3 = lws_role_by_name(((wsi->a).vhost)->listen_accept_role);
    if (prot == (char *)0x0) {
      pcStack_28 = ((wsi->a).vhost)->listen_accept_protocol;
    }
    if (plVar3 == (lws_role_ops *)0x0) {
      plVar4 = lwsl_wsi_get_cx(wsi);
      _lws_log_cx(plVar4,lws_log_prepend_wsi,wsi,1,"lws_role_call_adoption_bind",
                  "can\'t find role \'%s\'",((wsi->a).vhost)->listen_accept_role);
    }
    iVar2 = strcmp(((wsi->a).vhost)->listen_accept_role,"raw-proxy");
    if (iVar2 == 0) {
      prot_local._4_4_ = type | 0x20;
    }
    if ((plVar3 != (lws_role_ops *)0x0) && ((plVar3->rops_idx[8] & 0xf) != 0)) {
      iVar2 = (*plVar3->rops_table[(int)((plVar3->rops_idx[8] & 0xf) - 1)].check_upgrades)(wsi);
      if (iVar2 < 0) {
        return -1;
      }
      if (iVar2 != 0) {
        return 0;
      }
    }
    if ((prot_local._4_4_ & 0x1000000) != 0) {
      plVar4 = lwsl_wsi_get_cx(wsi);
      _lws_log_cx(plVar4,lws_log_prepend_wsi,wsi,0x10,"lws_role_call_adoption_bind",
                  "leaving bound to role %s",wsi->role_ops->name);
      return 0;
    }
    plVar4 = lwsl_wsi_get_cx(wsi);
    _lws_log_cx(plVar4,lws_log_prepend_wsi,wsi,2,"lws_role_call_adoption_bind",
                "adoption bind to role \'%s\', protocol \'%s\', type 0x%x, failed",
                ((wsi->a).vhost)->listen_accept_role,pcStack_28,prot_local._4_4_);
  }
  ar = (lws_role_ops *)available_roles;
  while (ar->name != (char *)0x0) {
    ppcVar5 = &ar->alpn;
    pcVar1 = ar->name;
    ar = (lws_role_ops *)ppcVar5;
    if (((pcVar1[0x20] & 0xfU) != 0) &&
       (iVar2 = (**(code **)(*(long *)(pcVar1 + 0x10) +
                            (long)(int)(((byte)pcVar1[0x20] & 0xf) - 1) * 8))
                          (wsi,prot_local._4_4_,pcStack_28), iVar2 != 0)) {
      return 0;
    }
  }
  iVar2 = rops_adoption_bind_raw_skt(wsi,prot_local._4_4_,pcStack_28);
  if (iVar2 != 0) {
    return 0;
  }
  plVar4 = lwsl_wsi_get_cx(wsi);
  _lws_log_cx(plVar4,lws_log_prepend_wsi,wsi,4,"lws_role_call_adoption_bind",
              "falling back to raw file role bind");
  iVar2 = rops_adoption_bind_raw_file(wsi,prot_local._4_4_,pcStack_28);
  if (iVar2 == 0) {
    return 1;
  }
  return 0;
}

Assistant:

int
lws_role_call_adoption_bind(struct lws *wsi, int type, const char *prot)
{
	int n;

	/*
	 * if the vhost is told to bind accepted sockets to a given role,
	 * then look it up by name and try to bind to the specific role.
	 */
	if (lws_check_opt(wsi->a.vhost->options,
			  LWS_SERVER_OPTION_ADOPT_APPLY_LISTEN_ACCEPT_CONFIG) &&
	    wsi->a.vhost->listen_accept_role) {
		const struct lws_role_ops *role =
			lws_role_by_name(wsi->a.vhost->listen_accept_role);

		if (!prot)
			prot = wsi->a.vhost->listen_accept_protocol;

		if (!role)
			lwsl_wsi_err(wsi, "can't find role '%s'",
					  wsi->a.vhost->listen_accept_role);

		if (!strcmp(wsi->a.vhost->listen_accept_role, "raw-proxy"))
			type |= LWS_ADOPT_FLAG_RAW_PROXY;

		if (role && lws_rops_fidx(role, LWS_ROPS_adoption_bind)) {
			n = (lws_rops_func_fidx(role, LWS_ROPS_adoption_bind)).
						adoption_bind(wsi, type, prot);
			if (n < 0)
				return -1;
			if (n) /* did the bind */
				return 0;
		}

		if (type & _LWS_ADOPT_FINISH) {
			lwsl_wsi_debug(wsi, "leaving bound to role %s",
					    wsi->role_ops->name);
			return 0;
		}

		lwsl_wsi_warn(wsi, "adoption bind to role '%s', "
			  "protocol '%s', type 0x%x, failed",
			  wsi->a.vhost->listen_accept_role, prot, type);
	}

	/*
	 * Otherwise ask each of the roles in order of preference if they
	 * want to bind to this accepted socket
	 */

	LWS_FOR_EVERY_AVAILABLE_ROLE_START(ar)
		if (lws_rops_fidx(ar, LWS_ROPS_adoption_bind) &&
		    (lws_rops_func_fidx(ar, LWS_ROPS_adoption_bind)).
					    adoption_bind(wsi, type, prot))
			return 0;
	LWS_FOR_EVERY_AVAILABLE_ROLE_END;

	/* fall back to raw socket role if, eg, h1 not configured */

	if (lws_rops_fidx(&role_ops_raw_skt, LWS_ROPS_adoption_bind) &&
	    (lws_rops_func_fidx(&role_ops_raw_skt, LWS_ROPS_adoption_bind)).
				    adoption_bind(wsi, type, prot))
		return 0;

#if defined(LWS_ROLE_RAW_FILE)

	lwsl_wsi_notice(wsi, "falling back to raw file role bind");

	/* fall back to raw file role if, eg, h1 not configured */

	if (lws_rops_fidx(&role_ops_raw_file, LWS_ROPS_adoption_bind) &&
	    (lws_rops_func_fidx(&role_ops_raw_file, LWS_ROPS_adoption_bind)).
				    adoption_bind(wsi, type, prot))
		return 0;
#endif

	return 1;
}